

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfskmsgbmdevice.cpp
# Opt level: O0

int __thiscall QEglFSKmsGbmDevice::close(QEglFSKmsGbmDevice *this,int __fd)

{
  bool bVar1;
  int iVar2;
  int extraout_EAX;
  
  bVar1 = usesEventReader((QEglFSKmsGbmDevice *)0x11858c);
  if (bVar1) {
    QEglFSKmsEventReader::destroy();
  }
  if (this->m_gbm_device != (gbm_device *)0x0) {
    gbm_device_destroy(this->m_gbm_device);
    this->m_gbm_device = (gbm_device *)0x0;
  }
  iVar2 = QKmsDevice::fd((QKmsDevice *)this);
  if (iVar2 != -1) {
    QKmsDevice::fd((QKmsDevice *)this);
    qt_safe_close((int)((ulong)this >> 0x20));
    QKmsDevice::setFd((QKmsDevice *)this,-1);
    iVar2 = extraout_EAX;
  }
  return iVar2;
}

Assistant:

void QEglFSKmsGbmDevice::close()
{
    // Note: screens are gone at this stage.

    if (usesEventReader())
        m_eventReader.destroy();

    if (m_gbm_device) {
        gbm_device_destroy(m_gbm_device);
        m_gbm_device = nullptr;
    }

    if (fd() != -1) {
        qt_safe_close(fd());
        setFd(-1);
    }
}